

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

void x86SatisfyJumps(FastVector<unsigned_char_*,_false,_false> *instPos)

{
  uchar *puVar1;
  uint uVar2;
  UnsatisfiedJump *pUVar3;
  uchar **ppuVar4;
  int value_5;
  int value_4;
  int value_3;
  int value_2;
  int value_1;
  int value;
  UnsatisfiedJump *uJmp;
  uint i;
  FastVector<unsigned_char_*,_false,_false> *instPos_local;
  
  uJmp._4_4_ = 0;
  do {
    uVar2 = FastVector<UnsatisfiedJump,_false,_false>::size(&pendingJumps);
    if (uVar2 <= uJmp._4_4_) {
      FastVector<UnsatisfiedJump,_false,_false>::clear(&pendingJumps);
      return;
    }
    pUVar3 = FastVector<UnsatisfiedJump,_false,_false>::operator[](&pendingJumps,uJmp._4_4_);
    if ((pUVar3->isNear & 1U) == 0) {
      if (*pUVar3->jmpPos == 0xe8) {
        ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&labels,pUVar3->labelID);
        *(int *)(pUVar3->jmpPos + 1) = ((int)*ppuVar4 - (int)pUVar3->jmpPos) + -5;
      }
      else if (*pUVar3->jmpPos == 0x8d) {
        ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&labels,pUVar3->labelID);
        *(int *)(pUVar3->jmpPos + 2) = (int)*ppuVar4;
      }
      else {
        puVar1 = pUVar3->jmpPos;
        ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&labels,pUVar3->labelID);
        if (0xff < (long)(puVar1 + (0x80 - (long)*ppuVar4))) {
          __assert_fail("uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                        ,0x964,"void x86SatisfyJumps(FastVector<unsigned char *> &)");
        }
        ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&labels,pUVar3->labelID);
        pUVar3->jmpPos[1] = ((char)*ppuVar4 - (char)pUVar3->jmpPos) + 0xfe;
      }
    }
    else if (*pUVar3->jmpPos == 0xe8) {
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (instPos,pUVar3->labelID & 0xffffff);
      *(int *)(pUVar3->jmpPos + 1) = ((int)*ppuVar4 - (int)pUVar3->jmpPos) + -5;
    }
    else if (*pUVar3->jmpPos == 0x8d) {
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (instPos,pUVar3->labelID & 0xffffff);
      *(int *)(pUVar3->jmpPos + 2) = (int)*ppuVar4;
    }
    else if (*pUVar3->jmpPos == '\x0f') {
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (instPos,pUVar3->labelID & 0xffffff);
      *(int *)(pUVar3->jmpPos + 2) = ((int)*ppuVar4 - (int)pUVar3->jmpPos) + -6;
    }
    else {
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (instPos,pUVar3->labelID & 0xffffff);
      *(int *)(pUVar3->jmpPos + 1) = ((int)*ppuVar4 - (int)pUVar3->jmpPos) + -5;
    }
    uJmp._4_4_ = uJmp._4_4_ + 1;
  } while( true );
}

Assistant:

void x86SatisfyJumps(FastVector<unsigned char*>& instPos)
{
	for(unsigned int i = 0; i < pendingJumps.size(); i++)
	{
		UnsatisfiedJump& uJmp = pendingJumps[i];
		if(uJmp.isNear)
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(instPos[uJmp.labelID & 0x00ffffff]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				if(*uJmp.jmpPos == 0x0f)
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-6);
					memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
				}
				else
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
					memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
				}
			}
		}
		else
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(labels[uJmp.labelID] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(labels[uJmp.labelID]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				assert(uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256);
				*(char*)(uJmp.jmpPos+1) = (char)(labels[uJmp.labelID] - uJmp.jmpPos-2);
			}
		}
	}
	pendingJumps.clear();
}